

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DisallowEnumAlias_Test::TestBody
          (ValidationErrorTest_DisallowEnumAlias_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  Nonnull<char_*> pcVar1;
  size_t in_R9;
  string_view format;
  string result;
  string local_c0;
  string local_90;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Nonnull<char_*> local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_20;
  
  buffer = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "name: \"foo.proto\" enum_type {  name: \"Bar\"  value { name:\"ENUM_A\" number:0 }  value { name:\"ENUM_B\" number:0 }}"
             ,"");
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition. The next available enum value is 1.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_c0,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != buffer) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)buffer;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "\n        name: \"foo.proto\"\n        enum_type {\n          name: \"Bar\"\n          value { name: \"ENUM_A\" number: 10 }\n          value { name: \"ENUM_B\" number: 10 }\n          value { name: \"ENUM_C\" number: 11 }\n          value { name: \"ENUM_D\" number: 20 }\n        }"
             ,"");
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_58,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition. The next available enum value is 12.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_c0,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_58);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != buffer) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(0x7fffffff,buffer->_M_local_buf);
  local_c0._M_dataplus._M_p = pcVar1 + -(long)buffer;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_28;
  format._M_len =
       (size_t)
       "\n                         name: \"foo.proto\"\n                         enum_type {\n                           name: \"Bar\"\n                           value { name: \"ENUM_A\" number: $0 }\n                           value { name: \"ENUM_B\" number: $0 }\n                         }"
  ;
  local_c0._M_string_length = (size_type)buffer;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_28 = local_c0._M_dataplus._M_p;
  local_20 = buffer;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_90,(Nonnull<std::string_*>)0x110,format,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_70,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_90,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_70);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DisallowEnumAlias) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "enum_type {"
      "  name: \"Bar\""
      "  value { name:\"ENUM_A\" number:0 }"
      "  value { name:\"ENUM_B\" number:0 }"
      "}",
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 1.\n");

  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        enum_type {
          name: "Bar"
          value { name: "ENUM_A" number: 10 }
          value { name: "ENUM_B" number: 10 }
          value { name: "ENUM_C" number: 11 }
          value { name: "ENUM_D" number: 20 }
        })pb",
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 12.\n");

  BuildFileWithErrors(
      absl::Substitute(R"pb(
                         name: "foo.proto"
                         enum_type {
                           name: "Bar"
                           value { name: "ENUM_A" number: $0 }
                           value { name: "ENUM_B" number: $0 }
                         })pb",
                       std::numeric_limits<int32_t>::max()),
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition.\n");
}